

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O0

void Hop_TableResize(Hop_Man_t *p)

{
  Hop_Obj_t **__ptr;
  int iVar1;
  int iVar2;
  Hop_Obj_t **ppHVar3;
  Hop_Obj_t *local_58;
  Hop_Obj_t *local_50;
  abctime clk;
  int i;
  int nEntries;
  int Counter;
  int nTableSizeOld;
  Hop_Obj_t **ppPlace;
  Hop_Obj_t **pTableOld;
  Hop_Obj_t *pNext;
  Hop_Obj_t *pEntry;
  Hop_Man_t *p_local;
  
  Abc_Clock();
  __ptr = p->pTable;
  iVar2 = p->nTableSize;
  iVar1 = Hop_ManNodeNum(p);
  iVar1 = Abc_PrimeCudd(iVar1 << 1);
  p->nTableSize = iVar1;
  ppHVar3 = (Hop_Obj_t **)malloc((long)p->nTableSize << 3);
  p->pTable = ppHVar3;
  memset(p->pTable,0,(long)p->nTableSize << 3);
  i = 0;
  clk._0_4_ = 0;
  do {
    if (iVar2 <= (int)clk) {
      iVar2 = Hop_ManNodeNum(p);
      if (i != iVar2) {
        __assert_fail("Counter == nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                      ,0xc2,"void Hop_TableResize(Hop_Man_t *)");
      }
      if (__ptr != (Hop_Obj_t **)0x0) {
        free(__ptr);
      }
      return;
    }
    pNext = __ptr[(int)clk];
    if (pNext == (Hop_Obj_t *)0x0) {
      local_50 = (Hop_Obj_t *)0x0;
    }
    else {
      local_50 = (pNext->field_1).pNext;
    }
    pTableOld = (Hop_Obj_t **)local_50;
    while (pNext != (Hop_Obj_t *)0x0) {
      ppHVar3 = Hop_TableFind(p,pNext);
      if (*ppHVar3 != (Hop_Obj_t *)0x0) {
        __assert_fail("*ppPlace == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTable.c"
                      ,0xbb,"void Hop_TableResize(Hop_Man_t *)");
      }
      *ppHVar3 = pNext;
      (pNext->field_1).pNext = (Hop_Obj_t *)0x0;
      i = i + 1;
      pNext = (Hop_Obj_t *)pTableOld;
      if (pTableOld == (Hop_Obj_t **)0x0) {
        local_58 = (Hop_Obj_t *)0x0;
      }
      else {
        local_58 = pTableOld[1];
      }
      pTableOld = (Hop_Obj_t **)local_58;
    }
    clk._0_4_ = (int)clk + 1;
  } while( true );
}

Assistant:

void Hop_TableResize( Hop_Man_t * p )
{
    Hop_Obj_t * pEntry, * pNext;
    Hop_Obj_t ** pTableOld, ** ppPlace;
    int nTableSizeOld, Counter, nEntries, i;
    abctime clk;
clk = Abc_Clock();
    // save the old table
    pTableOld = p->pTable;
    nTableSizeOld = p->nTableSize;
    // get the new table
    p->nTableSize = Abc_PrimeCudd( 2 * Hop_ManNodeNum(p) ); 
    p->pTable = ABC_ALLOC( Hop_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Hop_Obj_t *) * p->nTableSize );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nTableSizeOld; i++ )
    for ( pEntry = pTableOld[i], pNext = pEntry? pEntry->pNext : NULL; pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the table 
        ppPlace = Hop_TableFind( p, pEntry );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    nEntries = Hop_ManNodeNum(p);
    assert( Counter == nEntries );
//    printf( "Increasing the structural table size from %6d to %6d. ", nTableSizeOld, p->nTableSize );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( pTableOld );
}